

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string *scripts_dir_00;
  char *pcVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined1 local_14c8 [8];
  random_device rd;
  string output_dir;
  string type;
  path textures_path;
  path scripts_path;
  undefined1 local_b8 [8];
  string media_dir;
  undefined1 local_90 [8];
  string textures_dir;
  string scripts_dir;
  uint textures;
  uint start;
  PatternGeneration pattern_generation;
  uint local_38;
  uint local_34;
  uint resolution;
  
  scripts_dir.field_2._8_4_ = 0;
  scripts_dir.field_2._12_4_ = 0;
  local_38 = 0;
  output_dir.field_2._8_8_ = &type._M_string_length;
  type._M_dataplus._M_p = (pointer)0x0;
  type._M_string_length._0_1_ = 0;
  local_b8 = (undefined1  [8])&media_dir._M_string_length;
  media_dir._M_dataplus._M_p = (pointer)0x0;
  media_dir._M_string_length._0_1_ = 0;
  rd.field_0._M_mt._M_p = (size_t)&output_dir._M_string_length;
  output_dir._M_dataplus._M_p = (pointer)0x0;
  output_dir._M_string_length._0_1_ = 0;
  parseArgs(argc,argv,(uint *)(scripts_dir.field_2._M_local_buf + 8),
            (uint *)(scripts_dir.field_2._M_local_buf + 0xc),(string *)local_b8,&local_38,
            (string *)((long)&output_dir.field_2 + 8));
  local_90 = (undefined1  [8])&textures_dir._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_b8,media_dir._M_dataplus._M_p + (long)local_b8);
  std::__cxx11::string::append(local_90);
  textures_dir.field_2._8_8_ = &scripts_dir._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&textures_dir.field_2 + 8),local_b8,
             media_dir._M_dataplus._M_p + (long)local_b8);
  std::__cxx11::string::append(textures_dir.field_2._M_local_buf + 8);
  type.field_2._8_8_ = &textures_path.m_pathname._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&type.field_2 + 8),local_90,
             textures_dir._M_dataplus._M_p + (long)local_90);
  cVar2 = boost::filesystem::detail::create_directories
                    ((path *)((long)&type.field_2 + 8),(error_code *)0x0);
  if (cVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Created ",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,(long)textures_dir._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," folder",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  textures_path.m_pathname.field_2._8_8_ = &scripts_path.m_pathname._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&textures_path.m_pathname.field_2 + 8),textures_dir.field_2._8_8_,
             scripts_dir._M_dataplus._M_p + textures_dir.field_2._8_8_);
  cVar2 = boost::filesystem::detail::create_directories
                    ((path *)((long)&textures_path.m_pathname.field_2 + 8),(error_code *)0x0);
  if (cVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Created ",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)textures_dir.field_2._8_8_,
                        (long)scripts_dir._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," folder",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  std::random_device::random_device((random_device *)local_14c8);
  std::random_device::_M_getval();
  PatternGeneration::PatternGeneration((PatternGeneration *)&textures);
  uVar5 = (ulong)(uint)scripts_dir.field_2._12_4_;
  media_dir.field_2._8_8_ = ZEXT48((uint)scripts_dir.field_2._8_4_);
  local_34 = scripts_dir.field_2._12_4_;
  if ((uint)scripts_dir.field_2._12_4_ < (uint)scripts_dir.field_2._8_4_) {
    scripts_path.m_pathname.field_2._8_8_ = -media_dir.field_2._8_8_;
    pcVar1 = output_dir.field_2._M_local_buf + 8;
    scripts_dir_00 = (string *)(&textures_dir.field_2._M_allocated_capacity + 1);
    do {
      uVar5 = uVar5 + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rGenerating ",0xc);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," of ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ostream::flush();
      iVar3 = std::__cxx11::string::compare(pcVar1);
      if (iVar3 == 0) {
        generateFlatTexture((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                            scripts_dir_00);
        generateChessTexture
                  ((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                   scripts_dir_00);
        generateGradientTexture
                  ((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                   scripts_dir_00);
LAB_0010565e:
        generatePerlinTexture
                  ((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                   scripts_dir_00);
      }
      else {
        iVar3 = std::__cxx11::string::compare(pcVar1);
        if (iVar3 == 0) goto LAB_0010565e;
        iVar3 = std::__cxx11::string::compare(pcVar1);
        if (iVar3 == 0) {
          generateGradientTexture
                    ((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                     scripts_dir_00);
        }
        else {
          iVar3 = std::__cxx11::string::compare(pcVar1);
          if (iVar3 == 0) {
            generateFlatTexture((PatternGeneration *)&textures,&local_38,&local_34,
                                (string *)local_90,scripts_dir_00);
          }
          else {
            iVar3 = std::__cxx11::string::compare(pcVar1);
            if (iVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"No valid option selected! Exiting...",0x24);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              exit(1);
            }
            generateChessTexture
                      ((PatternGeneration *)&textures,&local_38,&local_34,(string *)local_90,
                       scripts_dir_00);
          }
        }
      }
      local_34 = (uint)uVar5;
    } while (scripts_path.m_pathname.field_2._8_8_ + uVar5 != 0);
  }
  if (_pattern_generation != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_pattern_generation);
  }
  std::random_device::_M_fini();
  if ((size_type *)textures_path.m_pathname.field_2._8_8_ !=
      &scripts_path.m_pathname._M_string_length) {
    operator_delete((void *)textures_path.m_pathname.field_2._8_8_);
  }
  if ((size_type *)type.field_2._8_8_ != &textures_path.m_pathname._M_string_length) {
    operator_delete((void *)type.field_2._8_8_);
  }
  if ((size_type *)textures_dir.field_2._8_8_ != &scripts_dir._M_string_length) {
    operator_delete((void *)textures_dir.field_2._8_8_);
  }
  if (local_90 != (undefined1  [8])&textures_dir._M_string_length) {
    operator_delete((void *)local_90);
  }
  if ((size_type *)rd.field_0._M_mt._M_p != &output_dir._M_string_length) {
    operator_delete((void *)rd.field_0._M_mt._M_p);
  }
  if (local_b8 != (undefined1  [8])&media_dir._M_string_length) {
    operator_delete((void *)local_b8);
  }
  if ((size_type *)output_dir.field_2._8_8_ != &type._M_string_length) {
    operator_delete((void *)output_dir.field_2._8_8_);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // Command-line arguments
    unsigned int textures {0};
    unsigned int start {0};
    unsigned int resolution {0};
    std::string type;
    std::string media_dir;
    std::string output_dir;

    /* root directory */
    parseArgs(argc, argv, textures, start, media_dir, resolution, type);
    std::string textures_dir=media_dir+"textures/";
    std::string scripts_dir=media_dir+"scripts/";

    boost::filesystem::path textures_path(textures_dir);
    if (boost::filesystem::create_directories(textures_path)) {
        std::cout << "Created " << textures_dir << " folder"<< "\n";
    }

    boost::filesystem::path scripts_path(scripts_dir);
    if (boost::filesystem::create_directories(scripts_path)) {
        std::cout << "Created " << scripts_dir << " folder"<< "\n";
    }

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;

    /* Pattern generator object instance */
    PatternGeneration pattern_generation;

    for (unsigned int i = start; i < textures; ++i)
    {
        std::cout << "\rGenerating " << i + 1 << " of " << textures << std::flush;

        if (type=="all")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="perlin")
        {
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="gradient")
        {
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="flat")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="chess")
        {
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else
        {
            std::cerr << "No valid option selected! Exiting..." << std::endl;
            exit(EXIT_FAILURE);
        }
    }
    return 0;
}